

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O1

int impl_verify_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *public_key,
                       uint8_t *msg,size_t msglen,uint8_t *signature,size_t signature_len)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  size_t __n;
  proof2_t *ppVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  uint16_t *puVar9;
  size_t sVar10;
  size_t __size;
  uint8_t *puVar11;
  msgs_t *msgs;
  uint16_t *challengeP;
  randomTape_t *__ptr;
  uint16_t *missingLeaves;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint16_t uVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  uint leafIndex;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  randomTape_t *prVar22;
  uint8_t *puVar23;
  bool bVar24;
  signature2_t sig;
  mzd_local_t m_maskedKey [1];
  uint16_t hideList [1];
  commitments_t Cv;
  commitments_t Ch;
  tree_t treeCv;
  tree_t iSeedsTree;
  tree_t seed;
  mzd_local_t m_plaintext [1];
  bool local_240;
  signature2_t local_220;
  mzd_local_t local_1c0;
  ulong local_198;
  picnic_instance_t *local_190;
  uint8_t *local_188;
  commitments_t local_180 [4];
  commitments_t local_138;
  commitments_t local_128;
  lowmc_simulate_online_f local_118;
  size_t local_110;
  uint8_t *local_108;
  tree_t local_100;
  tree_t local_e0;
  tree_t local_c0 [2];
  mzd_local_t local_80 [2];
  
  local_188 = plaintext;
  local_110 = msglen;
  local_108 = msg;
  _Var5 = allocateSignature2(&local_220,instance);
  iVar6 = -1;
  if (_Var5) {
    uVar19 = (ulong)instance->digest_size + 0x20;
    iVar6 = 1;
    if (uVar19 <= signature_len) {
      memcpy(local_220.challenge,signature,(ulong)instance->digest_size);
      bVar1 = instance->digest_size;
      puVar23 = signature + bVar1;
      local_220.salt._0_8_ = *(undefined8 *)puVar23;
      local_220.salt._8_8_ = *(undefined8 *)(puVar23 + 8);
      local_220.salt._16_8_ = *(undefined8 *)(puVar23 + 0x10);
      local_220.salt._24_8_ = *(undefined8 *)(puVar23 + 0x18);
      expandChallenge(local_220.challengeC,local_220.challengeP,local_220.challenge,instance);
      sVar8 = revealSeedsSize((uint)instance->num_rounds,local_220.challengeC,
                              (ulong)instance->num_opened_rounds,instance);
      local_220.iSeedInfoLen = sVar8;
      if (sVar8 != 0xffffffffffffffff) {
        uVar2 = instance->num_rounds;
        bVar17 = instance->num_opened_rounds;
        puVar9 = getMissingLeavesList(local_220.challengeC,instance);
        sVar10 = openMerkleTreeSize((ulong)instance->num_rounds,puVar9,(ulong)uVar2 - (ulong)bVar17,
                                    instance);
        local_220.cvInfoLen = sVar10;
        free(puVar9);
        if (sVar10 != 0xffffffffffffffff) {
          local_180[0].hashes._0_2_ = 0;
          __size = revealSeedsSize((uint)instance->num_MPC_parties,(uint16_t *)local_180,1,instance)
          ;
          __n = local_220.iSeedInfoLen;
          iVar6 = 1;
          if (__size != 0xffffffffffffffff) {
            sVar10 = sVar8 + uVar19 + sVar10;
            uVar19 = (ulong)instance->num_rounds;
            if (uVar19 != 0) {
              uVar13 = (ulong)instance->num_opened_rounds;
              uVar16 = 0;
              do {
                uVar15 = (uint16_t)uVar16;
                bVar24 = uVar13 != 0;
                if (uVar13 == 0) {
LAB_0011c11c:
                  if (bVar24) goto LAB_0011c121;
                }
                else {
                  if (*local_220.challengeC != uVar15) {
                    uVar12 = 0;
                    do {
                      uVar18 = uVar13;
                      if (uVar13 - 1 == uVar12) break;
                      uVar18 = uVar12 + 1;
                      lVar20 = uVar12 + 1;
                      uVar12 = uVar18;
                    } while (local_220.challengeC[lVar20] != uVar15);
                    bVar24 = uVar18 < uVar13;
                    goto LAB_0011c11c;
                  }
LAB_0011c121:
                  uVar12 = 0xffffffffffffffff;
                  if (uVar13 != 0) {
                    uVar18 = 0;
                    do {
                      uVar12 = uVar18;
                      if (local_220.challengeC[uVar18] == uVar15) break;
                      uVar18 = uVar18 + 1;
                      uVar12 = 0xffffffffffffffff;
                    } while (uVar13 != uVar18);
                  }
                  if (instance->num_MPC_parties - 1 != (uint)local_220.challengeP[uVar12]) {
                    sVar10 = sVar10 + instance->view_size;
                  }
                  sVar10 = sVar10 + __size + (ulong)instance->digest_size +
                           (ulong)instance->view_size + (ulong)instance->input_output_size;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar19);
            }
            if (sVar10 == signature_len) {
              puVar23 = signature + (ulong)bVar1 + 0x20;
              local_220.iSeedInfo = (uint8_t *)malloc(local_220.iSeedInfoLen);
              memcpy(local_220.iSeedInfo,puVar23,__n);
              sVar8 = local_220.cvInfoLen;
              local_220.cvInfo = (uint8_t *)malloc(local_220.cvInfoLen);
              memcpy(local_220.cvInfo,puVar23 + __n,sVar8);
              local_240 = uVar19 != 0;
              if (local_240) {
                puVar23 = puVar23 + __n + sVar8;
                local_240 = true;
                uVar19 = 0;
                local_190 = instance;
                do {
                  uVar13 = (ulong)instance->num_opened_rounds;
                  bVar24 = uVar13 != 0;
                  uVar15 = (uint16_t)uVar19;
                  if (uVar13 == 0) {
LAB_0011c24d:
                    if (bVar24) goto LAB_0011c255;
                  }
                  else {
                    if (*local_220.challengeC != uVar15) {
                      uVar16 = 0;
                      do {
                        uVar12 = uVar13;
                        if (uVar13 - 1 == uVar16) break;
                        uVar12 = uVar16 + 1;
                        lVar20 = uVar16 + 1;
                        uVar16 = uVar12;
                      } while (local_220.challengeC[lVar20] != uVar15);
                      bVar24 = uVar12 < uVar13;
                      goto LAB_0011c24d;
                    }
LAB_0011c255:
                    allocateProof2(local_220.proofs + uVar19,local_190);
                    ppVar4 = local_220.proofs;
                    local_220.proofs[uVar19].seedInfoLen = __size;
                    puVar11 = (uint8_t *)malloc(__size);
                    instance = local_190;
                    ppVar4[uVar19].seedInfo = puVar11;
                    memcpy(puVar11,puVar23,__size);
                    uVar13 = 0xffffffffffffffff;
                    if ((ulong)instance->num_opened_rounds != 0) {
                      uVar16 = 0;
                      do {
                        uVar13 = uVar16;
                        if (local_220.challengeC[uVar16] == uVar15) break;
                        uVar16 = uVar16 + 1;
                        uVar13 = 0xffffffffffffffff;
                      } while (instance->num_opened_rounds != uVar16);
                    }
                    puVar23 = puVar23 + ppVar4[uVar19].seedInfoLen;
                    if (instance->num_MPC_parties - 1 == (uint)local_220.challengeP[uVar13]) {
LAB_0011c36e:
                      memcpy(local_220.proofs[uVar19].input,puVar23,
                             (ulong)instance->input_output_size);
                      bVar1 = instance->input_output_size;
                      if ((~(0xff << ((uint)bVar1 * 8 - (uint)(instance->lowmc).n & 0x1f)) &
                          (uint)local_220.proofs[uVar19].input[(ulong)bVar1 - 1]) != 0)
                      goto LAB_0011c3b3;
                      bVar17 = instance->view_size;
                      uVar13 = (ulong)bVar17;
                      memcpy(local_220.proofs[uVar19].msgs,puVar23 + bVar1,uVar13);
                      puVar23 = puVar23 + bVar1 + uVar13;
                      bVar24 = (~(0xff << ((uint)(instance->lowmc).m *
                                           (uint)(instance->lowmc).r * -3 + (uint)bVar17 * 8 & 0x1f)
                                 ) & (uint)local_220.proofs[uVar19].msgs[uVar13 - 1]) == 0;
                      if (bVar24) {
                        memcpy(local_220.proofs[uVar19].C,puVar23,(ulong)instance->digest_size);
                        puVar23 = puVar23 + instance->digest_size;
                        bVar24 = true;
                      }
                    }
                    else {
                      memcpy(ppVar4[uVar19].aux,puVar23,(ulong)instance->view_size);
                      bVar1 = instance->view_size;
                      puVar23 = puVar23 + bVar1;
                      if ((~(0xff << ((uint)(instance->lowmc).m * (uint)(instance->lowmc).r * -3 +
                                      (uint)bVar1 * 8 & 0x1f)) &
                          (uint)local_220.proofs[uVar19].aux[(ulong)bVar1 - 1]) == 0)
                      goto LAB_0011c36e;
LAB_0011c3b3:
                      bVar24 = false;
                    }
                    if (!bVar24) break;
                  }
                  uVar19 = uVar19 + 1;
                  local_240 = uVar19 < instance->num_rounds;
                } while (local_240);
              }
              iVar6 = -(uint)local_240;
            }
          }
        }
      }
    }
    if (iVar6 == 0) {
      allocateCommitments2(local_180,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 1,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 2,instance,(ulong)instance->num_MPC_parties);
      allocateCommitments2(local_180 + 3,instance,(ulong)instance->num_MPC_parties);
      msgs = allocateMsgsVerify(instance);
      if (msgs == (msgs_t *)0x0) {
        iVar6 = -1;
      }
      else {
        _Var5 = createTree(&local_100,(uint)instance->num_rounds,(uint)instance->digest_size);
        iVar6 = -1;
        if (_Var5) {
          uVar19 = (ulong)((uint)instance->num_opened_rounds * 2);
          puVar9 = (uint16_t *)malloc(uVar19);
          challengeP = (uint16_t *)malloc(uVar19);
          uVar2 = instance->num_rounds;
          __ptr = (randomTape_t *)malloc((ulong)uVar2 * 0x98);
          if (((puVar9 == (uint16_t *)0x0) || (challengeP == (uint16_t *)0x0)) ||
             (iVar6 = -1, __ptr == (randomTape_t *)0x0)) {
            iVar6 = -1;
          }
          else {
            _Var5 = createTree(&local_e0,(uint)uVar2,(uint)instance->seed_size);
            if (_Var5) {
              iVar7 = reconstructSeeds(&local_e0,local_220.challengeC,
                                       (ulong)instance->num_opened_rounds,local_220.iSeedInfo,
                                       local_220.iSeedInfoLen,local_220.salt,0,instance);
              if (iVar7 == 0) {
                allocateCommitments2(&local_128,instance,(ulong)instance->num_rounds);
                allocateCommitments2(&local_138,instance,(ulong)instance->num_rounds);
                mzd_from_char_array(local_80,local_188,(ulong)instance->input_output_size);
                bVar1 = instance->num_MPC_parties;
                local_118 = lowmc_simulate_online_get_implementation(&instance->lowmc);
                iVar7 = 6;
                if (instance->num_rounds == 0) {
                  iVar6 = 0;
                }
                else {
                  sVar8 = (ulong)bVar1 - 1;
                  uVar19 = 0;
                  iVar6 = 0;
                  local_198 = (ulong)bVar1;
                  do {
                    uVar13 = (ulong)instance->num_opened_rounds;
                    bVar24 = uVar13 != 0;
                    leafIndex = (uint)uVar19;
                    if (uVar13 == 0) {
LAB_0011c688:
                      if (bVar24) goto LAB_0011c68c;
                      bVar1 = instance->num_MPC_parties;
                      puVar23 = getLeaf(&local_e0,leafIndex);
                      _Var5 = generateSeeds(local_c0,(uint)bVar1,puVar23,local_220.salt,uVar19,
                                            instance);
                      if (_Var5) goto LAB_0011c79c;
LAB_0011c710:
                      iVar6 = -1;
                      iVar7 = 9;
                    }
                    else {
                      if (uVar19 != *local_220.challengeC) {
                        uVar16 = 0;
                        do {
                          uVar12 = uVar13;
                          if (uVar13 - 1 == uVar16) break;
                          lVar20 = uVar16 + 1;
                          uVar12 = uVar16 + 1;
                          uVar16 = uVar12;
                        } while (uVar19 != local_220.challengeC[lVar20]);
                        bVar24 = uVar12 < uVar13;
                        goto LAB_0011c688;
                      }
LAB_0011c68c:
                      _Var5 = createTree(local_c0,(uint)instance->num_MPC_parties,
                                         (uint)instance->seed_size);
                      if (!_Var5) goto LAB_0011c710;
                      uVar13 = 0xffffffffffffffff;
                      if ((ulong)instance->num_opened_rounds != 0) {
                        uVar16 = 0;
                        do {
                          uVar13 = uVar16;
                          if (uVar19 == local_220.challengeC[uVar16]) break;
                          uVar16 = uVar16 + 1;
                          uVar13 = 0xffffffffffffffff;
                        } while (instance->num_opened_rounds != uVar16);
                      }
                      local_1c0.w64[0] =
                           CONCAT62(local_1c0.w64[0]._2_6_,local_220.challengeP[uVar13]);
                      iVar6 = reconstructSeeds(local_c0,(uint16_t *)&local_1c0,1,
                                               local_220.proofs[uVar19].seedInfo,
                                               local_220.proofs[uVar19].seedInfoLen,local_220.salt,
                                               leafIndex,instance);
                      if (iVar6 == 0) {
                        iVar6 = 0;
LAB_0011c79c:
                        prVar22 = __ptr + uVar19;
                        puVar23 = getLeaves(local_c0);
                        createRandomTapes(prVar22,puVar23,local_220.salt,uVar19,instance);
                        uVar13 = (ulong)instance->num_opened_rounds;
                        bVar24 = uVar13 != 0;
                        if (uVar13 == 0) {
LAB_0011c810:
                          if (bVar24) goto LAB_0011c814;
                          computeAuxTape(prVar22,(uint8_t *)0x0,instance);
                          if (instance->num_MPC_parties != '\0') {
                            lVar20 = 0;
                            sVar10 = 0;
                            do {
                              uVar21 = (uint)sVar10;
                              local_1c0.w64[0] = (word)getLeaf(local_c0,uVar21);
                              local_1c0.w64[1] = (word)getLeaf(local_c0,uVar21 + 1);
                              local_1c0.w64[2] = (word)getLeaf(local_c0,uVar21 + 2);
                              local_1c0.w64[3] = (word)getLeaf(local_c0,uVar21 + 3);
                              commit_x4((uint8_t **)
                                        (*(long *)((long)&local_180[0].hashes +
                                                  (ulong)((leafIndex & 3) << 4)) + lVar20),
                                        (uint8_t **)&local_1c0,local_220.salt,uVar19,sVar10,instance
                                       );
                              sVar10 = sVar10 + 4;
                              lVar20 = lVar20 + 0x20;
                            } while (sVar10 < instance->num_MPC_parties);
                          }
                          puVar23 = *(uint8_t **)
                                     (*(long *)((long)&local_180[0].hashes +
                                               (ulong)((leafIndex & 3) << 4)) + -8 + local_198 * 8);
                          puVar11 = getLeaf(local_c0,(uint)sVar8);
                          commit(puVar23,puVar11,prVar22->aux_bits,local_220.salt,uVar19,sVar8,
                                 instance);
                        }
                        else {
                          if (uVar19 != *local_220.challengeC) {
                            uVar16 = 0;
                            do {
                              uVar12 = uVar13;
                              if (uVar13 - 1 == uVar16) break;
                              lVar20 = uVar16 + 1;
                              uVar12 = uVar16 + 1;
                              uVar16 = uVar12;
                            } while (uVar19 != local_220.challengeC[lVar20]);
                            bVar24 = uVar12 < uVar13;
                            goto LAB_0011c810;
                          }
LAB_0011c814:
                          uVar16 = 0xffffffffffffffff;
                          if (uVar13 != 0) {
                            uVar12 = 0;
                            do {
                              uVar16 = uVar12;
                              if (uVar19 == local_220.challengeC[uVar12]) break;
                              uVar12 = uVar12 + 1;
                              uVar16 = 0xffffffffffffffff;
                            } while (uVar13 != uVar12);
                          }
                          uVar2 = local_220.challengeP[uVar16];
                          if (instance->num_MPC_parties != '\0') {
                            lVar20 = 0;
                            sVar10 = 0;
                            do {
                              uVar21 = (uint)sVar10;
                              local_1c0.w64[0] = (word)getLeaf(local_c0,uVar21);
                              local_1c0.w64[1] = (word)getLeaf(local_c0,uVar21 + 1);
                              local_1c0.w64[2] = (word)getLeaf(local_c0,uVar21 + 2);
                              local_1c0.w64[3] = (word)getLeaf(local_c0,uVar21 + 3);
                              commit_x4((uint8_t **)
                                        (*(long *)((long)&local_180[0].hashes +
                                                  (ulong)((leafIndex & 3) << 4)) + lVar20),
                                        (uint8_t **)&local_1c0,local_220.salt,uVar19,sVar10,instance
                                       );
                              sVar10 = sVar10 + 4;
                              lVar20 = lVar20 + 0x20;
                            } while (sVar10 < instance->num_MPC_parties);
                          }
                          if (sVar8 != uVar2) {
                            puVar23 = *(uint8_t **)
                                       (*(long *)((long)&local_180[0].hashes +
                                                 (ulong)((leafIndex & 3) << 4)) + -8 + local_198 * 8
                                       );
                            puVar11 = getLeaf(local_c0,(uint)sVar8);
                            commit(puVar23,puVar11,local_220.proofs[uVar19].aux,local_220.salt,
                                   uVar19,sVar8,instance);
                          }
                          memcpy(*(void **)(*(long *)((long)&local_180[0].hashes +
                                                     (ulong)((leafIndex & 3) << 4)) +
                                           (ulong)uVar2 * 8),local_220.proofs[uVar19].C,
                                 (ulong)instance->digest_size);
                        }
                        if (uVar19 < (instance->num_rounds & 0xfffffffc)) {
                          if ((leafIndex + 1 & 3) == 0) {
                            commit_h_x4((uint8_t **)
                                        ((ulong)((leafIndex & 0xfffc) << 3) + (long)local_128.hashes
                                        ),local_180,instance);
                          }
                        }
                        else {
                          commit_h(local_128.hashes[uVar19],
                                   (commitments_t *)
                                   ((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)),
                                   instance);
                        }
                        clearTree(local_c0);
                        iVar7 = 0;
                      }
                      else {
                        clearTree(local_c0);
                        iVar6 = -1;
                        iVar7 = 9;
                      }
                    }
                    if (iVar7 != 0) goto LAB_0011cbb2;
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < instance->num_rounds);
                  iVar7 = 6;
                }
LAB_0011cbb2:
                if (iVar7 != 9) {
                  if (iVar7 != 6) goto LAB_0011cfee;
                  uVar2 = instance->num_rounds;
                  if ((ulong)uVar2 != 0) {
                    uVar19 = (ulong)instance->num_opened_rounds;
                    uVar13 = 0;
                    do {
                      bVar24 = uVar19 != 0;
                      if (uVar19 == 0) {
LAB_0011cc18:
                        if (!bVar24) {
                          local_138.hashes[uVar13] = (uint8_t *)0x0;
                        }
                      }
                      else if (uVar13 != *local_220.challengeC) {
                        uVar16 = 0;
                        do {
                          uVar12 = uVar19;
                          if (uVar19 - 1 == uVar16) break;
                          lVar20 = uVar16 + 1;
                          uVar12 = uVar16 + 1;
                          uVar16 = uVar12;
                        } while (uVar13 != local_220.challengeC[lVar20]);
                        bVar24 = uVar12 < uVar19;
                        goto LAB_0011cc18;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar13 != uVar2);
                  }
                  iVar7 = 0x13;
                  if (instance->num_opened_rounds != '\0') {
                    uVar19 = 0;
                    do {
                      uVar2 = local_220.challengeC[uVar19];
                      uVar3 = local_220.challengeP[uVar19];
                      puVar23 = local_220.proofs[uVar2].input;
                      prVar22 = __ptr + uVar2;
                      if ((instance->lowmc).r != '\0') {
                        puVar11 = local_220.proofs[uVar2].aux;
                        bVar1 = instance->num_MPC_parties;
                        lVar20 = 1;
                        uVar13 = 0;
                        lVar14 = 0;
                        do {
                          uVar16 = (ulong)(instance->lowmc).n;
                          if (uVar16 != 0) {
                            uVar12 = 0;
                            do {
                              uVar18 = lVar20 * uVar16 + uVar12 >> 3;
                              bVar17 = ~((char)uVar16 * (char)lVar20 + (char)uVar12) & 7;
                              prVar22->tape[(ulong)bVar1 - 1][uVar18] =
                                   (byte)((puVar11[lVar14 + uVar12 >> 3] >>
                                           (~(byte)(lVar14 + uVar12) & 7) & 1) << bVar17) |
                                   prVar22->tape[(ulong)bVar1 - 1][uVar18] & ~(byte)(1 << bVar17);
                              uVar12 = uVar12 + 1;
                              uVar16 = (ulong)(instance->lowmc).n;
                            } while (uVar12 < uVar16);
                            lVar14 = lVar14 + uVar12;
                          }
                          uVar13 = uVar13 + 1;
                          lVar20 = lVar20 + 2;
                        } while (uVar13 < (instance->lowmc).r);
                      }
                      uVar13 = (ulong)((uint)uVar3 * 8);
                      memset(*(void **)((long)prVar22->tape + uVar13),0,
                             (ulong)((uint)instance->view_size * 2));
                      memcpy(*(void **)((long)msgs->msgs + uVar13),local_220.proofs[uVar2].msgs,
                             (ulong)instance->view_size);
                      mzd_from_char_array(&local_1c0,puVar23,(ulong)instance->input_output_size);
                      msgs->unopened = (uint)uVar3;
                      msgs->pos = 0;
                      iVar6 = (*local_118)(&local_1c0,prVar22,msgs,local_80,public_key,instance);
                      if (iVar6 != 0) {
                        iVar6 = -1;
                        iVar7 = 9;
                        goto LAB_0011ce35;
                      }
                      commit_v(local_138.hashes[uVar2],local_220.proofs[uVar2].input,msgs,instance);
                      iVar6 = 0;
                      uVar19 = uVar19 + 1;
                    } while (uVar19 < instance->num_opened_rounds);
                    iVar7 = 0x13;
                  }
LAB_0011ce35:
                  if (iVar7 != 9) {
                    if (iVar7 != 0x13) goto LAB_0011cfee;
                    uVar2 = instance->num_rounds;
                    bVar1 = instance->num_opened_rounds;
                    missingLeaves = getMissingLeavesList(local_220.challengeC,instance);
                    iVar7 = addMerkleNodes(&local_100,missingLeaves,(ulong)uVar2 - (ulong)bVar1,
                                           local_220.cvInfo,local_220.cvInfoLen);
                    free(missingLeaves);
                    iVar6 = -1;
                    if ((iVar7 == 0) &&
                       (iVar7 = verifyMerkleTree(&local_100,local_138.hashes,local_220.salt,instance
                                                ), iVar7 == 0)) {
                      HCP((uint8_t *)local_c0,puVar9,challengeP,&local_128,local_100.nodes,
                          local_220.salt,public_key,local_188,local_108,local_110,instance);
                      iVar6 = bcmp(local_220.challenge,local_c0,(ulong)instance->digest_size);
                      iVar6 = -(uint)(iVar6 != 0);
                    }
                  }
                }
                if (instance->num_rounds != 0) {
                  uVar19 = 0;
                  prVar22 = __ptr;
                  do {
                    freeRandomTape(prVar22);
                    uVar19 = uVar19 + 1;
                    prVar22 = prVar22 + 1;
                  } while (uVar19 < instance->num_rounds);
                }
                freeCommitments2(&local_138);
                freeCommitments2(&local_128);
              }
              clearTree(&local_e0);
            }
          }
          free(__ptr);
          free(challengeP);
          free(puVar9);
          clearTree(&local_100);
        }
        freeMsgs(msgs);
      }
      freeCommitments2(local_180 + 3);
      freeCommitments2(local_180 + 2);
      freeCommitments2(local_180 + 1);
      freeCommitments2(local_180);
    }
  }
LAB_0011cfee:
  freeSignature2(&local_220,instance);
  return iVar6;
}

Assistant:

int impl_verify_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                        const uint8_t* public_key, const uint8_t* msg, size_t msglen,
                        const uint8_t* signature, size_t signature_len) {
  int ret = -1;
  signature2_t sig;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = deserializeSignature2(&sig, signature, signature_len, instance);
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to deserialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = verify_picnic3(&sig, public_key, plaintext, msg, msglen, instance);

Exit:
  freeSignature2(&sig, instance);
  return ret;
}